

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void Js::ScriptContext::RecyclerEnumClassEnumeratorCallback(void *address,size_t size)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  BOOL BVar5;
  ScriptContext *this;
  FunctionInfo *pFVar6;
  undefined4 *puVar7;
  JavascriptMethod p_Var8;
  FunctionProxy *this_00;
  JavascriptMethod p_Var9;
  ScriptFunction *this_01;
  ProxyEntryPointInfo *entryPointInfo;
  ScriptFunction *scriptFunction;
  FunctionProxy *proxy;
  JavascriptMethod entryPoint;
  ScriptContext *scriptContext;
  JavascriptFunction *pFunction;
  size_t size_local;
  void *address_local;
  
  this = RecyclableObject::GetScriptContext((RecyclableObject *)address);
  if (((((this != (ScriptContext *)0x0) &&
        (uVar3 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(),
        (uVar3 & 1) == 0)) && (bVar2 = IsEnumeratingRecyclerObjects(this), bVar2)) &&
      ((bVar2 = IsTraceDomCall(this), bVar2 ||
       ((iVar4 = (**(code **)(*address + 0x370))(), iVar4 == 0 &&
        (iVar4 = (**(code **)(*address + 0x378))(), iVar4 == 0)))))) &&
     ((bVar2 = IsEnumerateNonUserFunctionsOnly(this), !bVar2 ||
      (BVar5 = JavascriptFunction::IsScriptFunction((JavascriptFunction *)address), BVar5 == 0)))) {
    pFVar6 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)address);
    if (pFVar6 == (FunctionInfo *)JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x107d,
                                  "(pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk)"
                                  ,
                                  "pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)address);
    this_00 = JavascriptFunction::GetFunctionProxy((JavascriptFunction *)address);
    if (this_00 == (FunctionProxy *)0x0) {
      SetEntryPointToProfileThunk((JavascriptFunction *)address);
    }
    else {
      BVar5 = IsIntermediateCodeGenThunk(p_Var8);
      if ((BVar5 == 0) && (p_Var8 != DynamicProfileInfo::EnsureDynamicProfileInfoThunk)) {
        p_Var9 = GetProfileModeThunk(p_Var8);
        Output::Trace(ScriptProfilerPhase,L"\t\tJs::ScriptContext::GetProfileModeThunk : 0x%08X\n",
                      p_Var9);
        this_01 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>((JavascriptFunction *)address);
        entryPointInfo = FunctionProxy::GetDefaultEntryPointInfo(this_00);
        p_Var8 = GetProfileModeThunk(p_Var8);
        ScriptFunction::ChangeEntryPoint(this_01,entryPointInfo,p_Var8);
      }
    }
  }
  return;
}

Assistant:

void ScriptContext::RecyclerEnumClassEnumeratorCallback(void *address, size_t size)
    {
        // TODO: we are assuming its function because for now we are enumerating only on functions
        // In future if the RecyclerNewEnumClass is used of Recyclable objects or Dynamic object, we would need a check if it is function
        JavascriptFunction *pFunction = (JavascriptFunction *)address;

        ScriptContext* scriptContext = pFunction->GetScriptContext();
        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            // Can't enumerate from closed scriptcontext
            return;
        }

        if (!scriptContext->IsEnumeratingRecyclerObjects())
        {
            return; // function not from enumerating script context
        }

        if (!scriptContext->IsTraceDomCall() && (pFunction->IsExternalFunction() || pFunction->IsWinRTFunction()))
        {
            return;
        }

        if (scriptContext->IsEnumerateNonUserFunctionsOnly() && pFunction->IsScriptFunction())
        {
            return;
        }

        // Wrapped function are not allocated with the EnumClass bit
        Assert(pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk);

        JavascriptMethod entryPoint = pFunction->GetEntryPoint();
        FunctionProxy *proxy = pFunction->GetFunctionProxy();

        if (proxy != NULL)
        {
#if defined(ENABLE_SCRIPT_PROFILING)
#if ENABLE_DEBUG_CONFIG_OPTIONS
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("ScriptContext::RecyclerEnumClassEnumeratorCallback\n"));
            OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("\tFunctionProxy : 0x%08X, FunctionNumber : %s, DeferredParseAttributes : %d, EntryPoint : 0x%08X"),
                (DWORD_PTR)proxy, proxy->GetDebugNumberSet(debugStringBuffer), proxy->GetAttributes(), (DWORD_PTR)entryPoint);
#if ENABLE_NATIVE_CODEGEN
            OUTPUT_TRACE(Js::ScriptProfilerPhase, _u(" (IsIntermediateCodeGenThunk : %s, isNative : %s)\n"),
                IsTrueOrFalse(IsIntermediateCodeGenThunk(entryPoint)), IsTrueOrFalse(scriptContext->IsNativeAddress(entryPoint)));
#endif
            OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("\n"));
#endif

#if ENABLE_NATIVE_CODEGEN
            if (!IsIntermediateCodeGenThunk(entryPoint) && entryPoint != DynamicProfileInfo::EnsureDynamicProfileInfoThunk)
#endif
            {
                OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("\t\tJs::ScriptContext::GetProfileModeThunk : 0x%08X\n"), (DWORD_PTR)Js::ScriptContext::GetProfileModeThunk(entryPoint));

                ScriptFunction * scriptFunction = VarTo<ScriptFunction>(pFunction);
                scriptFunction->ChangeEntryPoint(proxy->GetDefaultEntryPointInfo(), Js::ScriptContext::GetProfileModeThunk(entryPoint));

#if ENABLE_NATIVE_CODEGEN && defined(ENABLE_SCRIPT_PROFILING)
                OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("\tUpdated entrypoint : 0x%08X (isNative : %s)\n"), (DWORD_PTR)pFunction->GetEntryPoint(), IsTrueOrFalse(scriptContext->IsNativeAddress(entryPoint)));
#endif
            }
        }
        else
        {
            ScriptContext::SetEntryPointToProfileThunk(pFunction);
        }
    }